

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDiscardTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::sr::anon_unknown_0::ShaderDiscardCase::createInstance(ShaderDiscardCase *this,Context *context)

{
  bool bVar1;
  TestInstance *this_00;
  ShaderEvaluator *evaluator;
  UniformSetup *uniformSetup;
  Context *context_local;
  ShaderDiscardCase *this_local;
  
  this_00 = (TestInstance *)operator_new(0x210);
  bVar1 = (this->super_ShaderRenderCase).m_isVertexCase;
  evaluator = de::details::
              UniqueBase<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>
              ::operator*(&(this->super_ShaderRenderCase).m_evaluator.
                           super_UniqueBase<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>
                         );
  uniformSetup = de::details::
                 UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
                 ::operator*(&(this->super_ShaderRenderCase).m_uniformSetup.
                              super_UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
                            );
  ShaderDiscardCaseInstance::ShaderDiscardCaseInstance
            ((ShaderDiscardCaseInstance *)this_00,context,(bool)(bVar1 & 1),evaluator,uniformSetup,
             (bool)(this->m_usesTexture & 1));
  return this_00;
}

Assistant:

virtual TestInstance*	createInstance				(Context& context) const
							{
								DE_ASSERT(m_evaluator != DE_NULL);
								DE_ASSERT(m_uniformSetup != DE_NULL);
								return new ShaderDiscardCaseInstance(context, m_isVertexCase, *m_evaluator, *m_uniformSetup, m_usesTexture);
							}